

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void handle_winner_cand(MB_MODE_INFO *mbmi,motion_mode_best_st_candidate *best_motion_mode_cands,
                       int max_winner_motion_mode_cand,int64_t this_rd,
                       motion_mode_candidate *motion_mode_cand,int skip_motion_mode)

{
  long in_RCX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  void *in_R8;
  undefined4 in_R9D;
  int j;
  int valid_motion_mode_cand_loc;
  int num_motion_mode_cand;
  int local_50;
  int local_4c;
  int local_38;
  int local_34;
  
  local_4c = *(int *)(in_RSI + 2000);
  local_38 = 0;
  do {
    local_34 = local_4c;
    if (local_4c <= local_38) {
LAB_002cc1d5:
      if (local_34 < in_EDX) {
        if ((0 < local_4c) && (local_34 < in_EDX + -1)) {
          if (in_EDX + -1 <= local_4c) {
            local_4c = in_EDX + -1;
          }
          memmove((void *)(in_RSI + (long)(local_34 + 1) * 200),
                  (void *)(in_RSI + (long)local_34 * 200),(long)(local_4c - local_34) * 200);
        }
        memcpy(in_R8,in_RDI,0xb0);
        *(long *)((long)in_R8 + 0xc0) = in_RCX;
        *(undefined4 *)((long)in_R8 + 0xb8) = in_R9D;
        memcpy((void *)(in_RSI + (long)local_34 * 200),in_R8,200);
        local_50 = in_EDX;
        if (*(int *)(in_RSI + 2000) + 1 <= in_EDX) {
          local_50 = *(int *)(in_RSI + 2000) + 1;
        }
        *(int *)(in_RSI + 2000) = local_50;
      }
      return;
    }
    if (in_RCX < *(long *)(in_RSI + (long)local_38 * 200 + 0xc0)) {
      local_34 = local_38;
      goto LAB_002cc1d5;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static void handle_winner_cand(
    MB_MODE_INFO *const mbmi,
    motion_mode_best_st_candidate *best_motion_mode_cands,
    int max_winner_motion_mode_cand, int64_t this_rd,
    motion_mode_candidate *motion_mode_cand, int skip_motion_mode) {
  // Number of current motion mode candidates in list
  const int num_motion_mode_cand = best_motion_mode_cands->num_motion_mode_cand;
  int valid_motion_mode_cand_loc = num_motion_mode_cand;

  // find the best location to insert new motion mode candidate
  for (int j = 0; j < num_motion_mode_cand; j++) {
    if (this_rd < best_motion_mode_cands->motion_mode_cand[j].rd_cost) {
      valid_motion_mode_cand_loc = j;
      break;
    }
  }

  // Insert motion mode if location is found
  if (valid_motion_mode_cand_loc < max_winner_motion_mode_cand) {
    if (num_motion_mode_cand > 0 &&
        valid_motion_mode_cand_loc < max_winner_motion_mode_cand - 1)
      memmove(
          &best_motion_mode_cands
               ->motion_mode_cand[valid_motion_mode_cand_loc + 1],
          &best_motion_mode_cands->motion_mode_cand[valid_motion_mode_cand_loc],
          (AOMMIN(num_motion_mode_cand, max_winner_motion_mode_cand - 1) -
           valid_motion_mode_cand_loc) *
              sizeof(best_motion_mode_cands->motion_mode_cand[0]));
    motion_mode_cand->mbmi = *mbmi;
    motion_mode_cand->rd_cost = this_rd;
    motion_mode_cand->skip_motion_mode = skip_motion_mode;
    best_motion_mode_cands->motion_mode_cand[valid_motion_mode_cand_loc] =
        *motion_mode_cand;
    best_motion_mode_cands->num_motion_mode_cand =
        AOMMIN(max_winner_motion_mode_cand,
               best_motion_mode_cands->num_motion_mode_cand + 1);
  }
}